

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# des.cc
# Opt level: O0

void DES_ecb3_encrypt_ex(uint8_t *in,uint8_t *out,DES_key_schedule *ks1,DES_key_schedule *ks2,
                        DES_key_schedule *ks3,int enc)

{
  uint32_t local_3c;
  uint32_t local_38;
  uint32_t ll [2];
  int enc_local;
  DES_key_schedule *ks3_local;
  DES_key_schedule *ks2_local;
  DES_key_schedule *ks1_local;
  uint8_t *out_local;
  uint8_t *in_local;
  
  ll[0] = enc;
  unique0x10000096 = (DES_key_schedule *)ks3;
  local_3c = CRYPTO_load_u32_le(in);
  local_38 = CRYPTO_load_u32_le(in + 4);
  if (ll[0] == 0) {
    DES_decrypt3(&local_3c,(DES_key_schedule *)ks1,(DES_key_schedule *)ks2,stack0xffffffffffffffd0);
  }
  else {
    DES_encrypt3(&local_3c,(DES_key_schedule *)ks1,(DES_key_schedule *)ks2,stack0xffffffffffffffd0);
  }
  CRYPTO_store_u32_le(out,local_3c);
  CRYPTO_store_u32_le(out + 4,local_38);
  return;
}

Assistant:

void DES_ecb3_encrypt_ex(const uint8_t in[8], uint8_t out[8],
                         const DES_key_schedule *ks1,
                         const DES_key_schedule *ks2,
                         const DES_key_schedule *ks3, int enc) {
  uint32_t ll[2];
  ll[0] = CRYPTO_load_u32_le(in);
  ll[1] = CRYPTO_load_u32_le(in + 4);
  if (enc) {
    DES_encrypt3(ll, ks1, ks2, ks3);
  } else {
    DES_decrypt3(ll, ks1, ks2, ks3);
  }
  CRYPTO_store_u32_le(out, ll[0]);
  CRYPTO_store_u32_le(out + 4, ll[1]);
}